

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tensor_test.cc
# Opt level: O1

void __thiscall
anon_unknown.dwarf_791d::TENSOR_SWAP_AXIS_Test::TestBody(TENSOR_SWAP_AXIS_Test *this)

{
  void *pvVar1;
  bool bVar2;
  int *piVar3;
  long lVar4;
  char *pcVar5;
  initializer_list<int> __l;
  initializer_list<int> __l_00;
  initializer_list<int> __l_01;
  initializer_list<std::vector<int,_std::allocator<int>_>_> __l_02;
  initializer_list<int> __l_03;
  initializer_list<int> __l_04;
  initializer_list<int> __l_05;
  initializer_list<std::vector<int,_std::allocator<int>_>_> __l_06;
  initializer_list<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>
  __l_07;
  array<unsigned_int,_3UL> size;
  AssertionResult gtest_ar;
  tensor<int,_3U> ts;
  allocator_type local_1b1;
  allocator_type local_1b0;
  allocator_type local_1af;
  allocator_type local_1ae;
  allocator_type local_1ad;
  allocator_type local_1ac;
  allocator_type local_1ab;
  allocator_type local_1aa;
  allocator_type local_1a9;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  local_1a8 [2];
  vector<int,_std::allocator<int>_> local_178;
  vector<int,_std::allocator<int>_> local_160;
  vector<int,_std::allocator<int>_> local_148;
  vector<int,_std::allocator<int>_> local_130;
  vector<int,_std::allocator<int>_> local_118;
  vector<int,_std::allocator<int>_> local_100;
  vector<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>,_std::allocator<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>_>
  local_e8;
  tensor<int,_3U> local_d0;
  int local_90 [8];
  undefined1 *local_70;
  undefined8 uStack_68;
  int local_60 [8];
  undefined1 *local_40;
  undefined8 uStack_38;
  
  local_40 = &DAT_200000001;
  uStack_38 = 0x400000003;
  __l._M_len = 4;
  __l._M_array = (iterator)&local_40;
  std::vector<int,_std::allocator<int>_>::vector(&local_130,__l,&local_1a9);
  local_60[4] = 5;
  local_60[5] = 6;
  local_60[6] = 7;
  local_60[7] = 8;
  __l_00._M_len = 4;
  __l_00._M_array = local_60 + 4;
  std::vector<int,_std::allocator<int>_>::vector(&local_118,__l_00,&local_1aa);
  local_60[0] = 9;
  local_60[1] = 10;
  local_60[2] = 0xb;
  local_60[3] = 0xc;
  __l_01._M_len = 4;
  __l_01._M_array = local_60;
  std::vector<int,_std::allocator<int>_>::vector(&local_100,__l_01,&local_1ab);
  __l_02._M_len = 3;
  __l_02._M_array = &local_130;
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::vector(local_1a8,__l_02,&local_1ac);
  local_70 = &DAT_200000001;
  uStack_68 = 0x400000003;
  __l_03._M_len = 4;
  __l_03._M_array = (iterator)&local_70;
  std::vector<int,_std::allocator<int>_>::vector(&local_178,__l_03,&local_1ad);
  local_90[4] = 5;
  local_90[5] = 6;
  local_90[6] = 7;
  local_90[7] = 8;
  __l_04._M_len = 4;
  __l_04._M_array = local_90 + 4;
  std::vector<int,_std::allocator<int>_>::vector(&local_160,__l_04,&local_1ae);
  local_90[0] = 9;
  local_90[1] = 10;
  local_90[2] = 0xb;
  local_90[3] = 0xc;
  __l_05._M_len = 4;
  __l_05._M_array = local_90;
  std::vector<int,_std::allocator<int>_>::vector(&local_148,__l_05,&local_1af);
  __l_06._M_len = 3;
  __l_06._M_array = &local_178;
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::vector(local_1a8 + 1,__l_06,&local_1b0);
  __l_07._M_len = 2;
  __l_07._M_array = local_1a8;
  std::
  vector<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>,_std::allocator<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>_>
  ::vector(&local_e8,__l_07,&local_1b1);
  size._M_elems[2] = 4;
  size._M_elems._0_8_ = &DAT_300000002;
  dnet::data_types::tensor<int,_3U>::tensor(&local_d0,&local_e8,size);
  std::
  vector<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>,_std::allocator<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>_>
  ::~vector(&local_e8);
  lVar4 = 0x18;
  do {
    std::
    vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ::~vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               *)((long)&local_1a8[0].
                         super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start + lVar4));
    lVar4 = lVar4 + -0x18;
  } while (lVar4 != -0x18);
  lVar4 = 0x30;
  do {
    pvVar1 = *(void **)((long)&local_178.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_start + lVar4);
    if (pvVar1 != (void *)0x0) {
      operator_delete(pvVar1);
    }
    lVar4 = lVar4 + -0x18;
  } while (lVar4 != -0x18);
  lVar4 = 0x30;
  do {
    pvVar1 = *(void **)((long)&local_130.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_start + lVar4);
    if (pvVar1 != (void *)0x0) {
      operator_delete(pvVar1);
    }
    lVar4 = lVar4 + -0x18;
  } while (lVar4 != -0x18);
  local_178.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)&DAT_100000001;
  local_178.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish.
  _0_4_ = 2;
  piVar3 = dnet::data_types::tensor<int,_3U>::operator[]
                     (&local_d0,(array<unsigned_int,_3UL> *)&local_178);
  local_1a8[0].
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start._0_4_ = 7;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&local_130,"(ts[{1, 1, 2}])","7",piVar3,(int *)local_1a8);
  if (local_130.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_178);
    if (local_130.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish == (pointer)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = *(char **)local_130.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_finish;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_1a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/Linyxus[P]deeper-net/src/data_types/tensor_test.cc"
               ,0x70,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_1a8,(Message *)&local_178);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_1a8);
    if ((long *)local_178.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start != (long *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) &&
         ((long *)local_178.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start != (long *)0x0)) {
        (**(code **)(*(long *)local_178.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start + 8))();
      }
      local_178.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_130.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_finish,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_178.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)&DAT_200000001;
  local_178.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish.
  _0_4_ = 1;
  piVar3 = dnet::data_types::tensor<int,_3U>::operator[]
                     (&local_d0,(array<unsigned_int,_3UL> *)&local_178);
  local_1a8[0].
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start._0_4_ = 7;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&local_130,"(ts[{1, 2, 1}])","7",piVar3,(int *)local_1a8);
  if (local_130.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_178);
    if (local_130.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish == (pointer)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = *(char **)local_130.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_finish;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_1a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/Linyxus[P]deeper-net/src/data_types/tensor_test.cc"
               ,0x72,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_1a8,(Message *)&local_178);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_1a8);
    if ((long *)local_178.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start != (long *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) &&
         ((long *)local_178.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start != (long *)0x0)) {
        (**(code **)(*(long *)local_178.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start + 8))();
      }
      local_178.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_130.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_finish,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_178.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)&DAT_100000002;
  local_178.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish.
  _0_4_ = 1;
  piVar3 = dnet::data_types::tensor<int,_3U>::operator[]
                     (&local_d0,(array<unsigned_int,_3UL> *)&local_178);
  local_1a8[0].
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start._0_4_ = 7;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&local_130,"(ts[{2, 1, 1}])","7",piVar3,(int *)local_1a8);
  if (local_130.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_178);
    if (local_130.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish == (pointer)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = *(char **)local_130.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_finish;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_1a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/Linyxus[P]deeper-net/src/data_types/tensor_test.cc"
               ,0x74,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_1a8,(Message *)&local_178);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_1a8);
    if ((long *)local_178.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start != (long *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) &&
         ((long *)local_178.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start != (long *)0x0)) {
        (**(code **)(*(long *)local_178.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start + 8))();
      }
      local_178.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_130.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_finish,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_178.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x3;
  local_178.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish.
  _0_4_ = 1;
  piVar3 = dnet::data_types::tensor<int,_3U>::operator[]
                     (&local_d0,(array<unsigned_int,_3UL> *)&local_178);
  local_1a8[0].
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start._0_4_ = 8;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&local_130,"(ts[{3, 0, 1}])","8",piVar3,(int *)local_1a8);
  if (local_130.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_178);
    if (local_130.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish == (pointer)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = *(char **)local_130.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_finish;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_1a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/Linyxus[P]deeper-net/src/data_types/tensor_test.cc"
               ,0x75,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_1a8,(Message *)&local_178);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_1a8);
    if ((long *)local_178.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start != (long *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) &&
         ((long *)local_178.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start != (long *)0x0)) {
        (**(code **)(*(long *)local_178.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start + 8))();
      }
      local_178.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_130.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_finish,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  if (local_d0._data.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_d0._data.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

TEST(TENSOR, SWAP_AXIS) {
        try {
            tensor<int, 3> ts({
                                      {
                                              {1, 2, 3, 4},
                                              {5, 6, 7, 8},
                                              {9, 10, 11, 12}
                                      },
                                      {
                                              {1, 2, 3, 4},
                                              {5, 6, 7, 8},
                                              {9, 10, 11, 12}
                                      }
                              }, {2, 3, 4});
            EXPECT_EQ((ts[{1, 1, 2}]), 7);
            ts.swap_axis(1, 2);
            EXPECT_EQ((ts[{1, 2, 1}]), 7);
            ts.swap_axis(0, 1);
            EXPECT_EQ((ts[{2, 1, 1}]), 7);
            EXPECT_EQ((ts[{3, 0, 1}]), 8);
        }
        catch (const dnet::misc::exception &e) {
            std::cout << e << std::endl;
        }
    }